

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O0

void __thiscall crnlib::dds_comp::dds_comp(dds_comp *this)

{
  dds_comp *this_local;
  
  itexture_comp::itexture_comp(&this->super_itexture_comp);
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__dds_comp_00259950;
  mipmapped_texture::mipmapped_texture(&this->m_src_tex);
  mipmapped_texture::mipmapped_texture(&this->m_packed_tex);
  vector<unsigned_char>::vector(&this->m_comp_data);
  this->m_pParams = (crn_comp_params *)0x0;
  this->m_pixel_fmt = PIXEL_FMT_INVALID;
  dxt_image::pack_params::pack_params(&this->m_pack_params);
  task_pool::task_pool(&this->m_task_pool);
  qdxt1_params::qdxt1_params(&this->m_q1_params);
  qdxt5_params::qdxt5_params(&this->m_q5_params);
  this->m_pQDXT_state = (qdxt_state *)0x0;
  return;
}

Assistant:

dds_comp::dds_comp()
    : m_pParams(NULL),
      m_pixel_fmt(PIXEL_FMT_INVALID),
      m_pQDXT_state(NULL) {
}